

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O1

zt_ipv4_node * zt_ipv4_node_str_init(char *netstr)

{
  zt_mem_pool *pool;
  zt_ipv4_node *pzVar1;
  zt_ipv4_addr *pzVar2;
  
  if ((((netstr != (char *)0x0) &&
       (pool = zt_mem_pool_get("zt_ipv4_node"), pool != (zt_mem_pool *)0x0)) &&
      (pzVar1 = (zt_ipv4_node *)zt_mem_pool_alloc(pool), pzVar1 != (zt_ipv4_node *)0x0)) &&
     (pzVar2 = zt_ipv4_addr_frm_str(netstr), pzVar2 != (zt_ipv4_addr *)0x0)) {
    pzVar1->addr = pzVar2;
    pzVar1->next = (zt_ipv4_node *)0x0;
    return pzVar1;
  }
  return (zt_ipv4_node *)0x0;
}

Assistant:

zt_ipv4_node   *
zt_ipv4_node_str_init(const char *netstr)
{
    zt_ipv4_node *node;
    zt_ipv4_addr *addr;
    zt_mem_pool  *pool;

    if (!netstr) {
        return NULL;
    }

    if (!(pool = zt_mem_pool_get("zt_ipv4_node"))) {
        return NULL;
    }

    if (!(node = zt_mem_pool_alloc(pool))) {
        return NULL;
    }

    if (!(addr = zt_ipv4_addr_frm_str(netstr))) {
        return NULL;
    }

    node->addr = addr;
    node->next = NULL;

    return node;
}